

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

void __thiscall
jsonnet::internal::Unparser::unparseSpecs
          (Unparser *this,
          vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
          *specs)

{
  bool bVar1;
  undefined8 *in_RDI;
  ComprehensionSpec *spec;
  const_iterator __end2;
  const_iterator __begin2;
  vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
  *__range2;
  undefined1 in_stack_000005a7;
  AST *in_stack_000005a8;
  Unparser *in_stack_000005b0;
  Identifier *in_stack_ffffffffffffff78;
  Unparser *in_stack_ffffffffffffff80;
  string local_50 [32];
  reference local_30;
  ComprehensionSpec *local_28;
  __normal_iterator<const_jsonnet::internal::ComprehensionSpec_*,_std::vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>_>
  local_20 [4];
  
  local_20[0]._M_current =
       (ComprehensionSpec *)
       std::
       vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
       ::begin((vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                *)in_stack_ffffffffffffff78);
  local_28 = (ComprehensionSpec *)
             std::
             vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
             ::end((vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                    *)in_stack_ffffffffffffff78);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_jsonnet::internal::ComprehensionSpec_*,_std::vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>_>
                             *)in_stack_ffffffffffffff80,
                            (__normal_iterator<const_jsonnet::internal::ComprehensionSpec_*,_std::vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>_>
                             *)in_stack_ffffffffffffff78), bVar1) {
    local_30 = __gnu_cxx::
               __normal_iterator<const_jsonnet::internal::ComprehensionSpec_*,_std::vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>_>
               ::operator*(local_20);
    fill(in_stack_ffffffffffffff80,(Fodder *)in_stack_ffffffffffffff78,false,false);
    if (local_30->kind == FOR) {
      std::operator<<((ostream *)*in_RDI,"for");
      fill(in_stack_ffffffffffffff80,(Fodder *)in_stack_ffffffffffffff78,false,false);
      in_stack_ffffffffffffff80 = (Unparser *)*in_RDI;
      unparse_id_abi_cxx11_(in_stack_ffffffffffffff78);
      std::operator<<((ostream *)in_stack_ffffffffffffff80,local_50);
      std::__cxx11::string::~string(local_50);
      fill(in_stack_ffffffffffffff80,(Fodder *)in_stack_ffffffffffffff78,false,false);
      std::operator<<((ostream *)*in_RDI,"in");
      unparse(in_stack_000005b0,in_stack_000005a8,(bool)in_stack_000005a7);
    }
    else if (local_30->kind == IF) {
      std::operator<<((ostream *)*in_RDI,"if");
      unparse(in_stack_000005b0,in_stack_000005a8,(bool)in_stack_000005a7);
    }
    __gnu_cxx::
    __normal_iterator<const_jsonnet::internal::ComprehensionSpec_*,_std::vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>_>
    ::operator++(local_20);
  }
  return;
}

Assistant:

void unparseSpecs(const std::vector<ComprehensionSpec> &specs)
    {
        for (const auto &spec : specs) {
            fill(spec.openFodder, true, true);
            switch (spec.kind) {
                case ComprehensionSpec::FOR:
                    o << "for";
                    fill(spec.varFodder, true, true);
                    o << unparse_id(spec.var);
                    fill(spec.inFodder, true, true);
                    o << "in";
                    unparse(spec.expr, true);
                    break;
                case ComprehensionSpec::IF:
                    o << "if";
                    unparse(spec.expr, true);
                    break;
            }
        }
    }